

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.hxx
# Opt level: O1

ptr<srv_config> __thiscall cornerstone::cluster_config::get_server(cluster_config *this,int id)

{
  long *plVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined4 in_register_00000034;
  long *plVar2;
  ptr<srv_config> pVar3;
  ptr<srv_config> pVar4;
  
  plVar2 = (long *)(CONCAT44(in_register_00000034,id) + 0x10);
  plVar1 = plVar2;
  do {
    plVar1 = (long *)*plVar1;
    if (plVar1 == plVar2) goto LAB_0014b469;
  } while (*(int *)plVar1[2] != (int)in_RDX._M_pi);
  this->log_idx_ = (ulong)plVar1[2];
  in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar1[3];
  this->prev_log_idx_ = (ulong)in_RDX._M_pi;
  if (in_RDX._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (in_RDX._M_pi)->_M_use_count = (in_RDX._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (in_RDX._M_pi)->_M_use_count = (in_RDX._M_pi)->_M_use_count + 1;
    }
  }
  if (plVar1 != plVar2) {
    pVar3.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = in_RDX._M_pi;
    pVar3.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (ptr<srv_config>)
           pVar3.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>;
  }
LAB_0014b469:
  this->log_idx_ = 0;
  this->prev_log_idx_ = 0;
  pVar4.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  pVar4.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<srv_config>)
         pVar4.super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<srv_config> get_server(int id) const
    {
        for (const_srv_itor it = servers_.begin(); it != servers_.end(); ++it)
        {
            if ((*it)->get_id() == id)
            {
                return *it;
            }
        }

        return ptr<srv_config>();
    }